

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O3

int iSplitByDep(Abc_Ntk_t *pNtk,Vec_Int_t **iDep,Vec_Int_t **iMatch,int *iGroup,int *iLastItem,
               int *oGroup)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  Vec_Int_t *p;
  int *piVar5;
  Vec_Int_t *p_00;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  Vec_Int_t *pVVar13;
  int iVar14;
  long lVar15;
  bool bVar16;
  
  iVar10 = *iLastItem;
  if (iVar10 < 1) {
    iVar14 = 0;
  }
  else {
    lVar12 = 0;
    iVar14 = 0;
    do {
      pVVar13 = iMatch[lVar12];
      iVar1 = pVVar13->nSize;
      if (iVar1 != 1) {
        p = (Vec_Int_t *)malloc(0x10);
        iVar10 = iVar1;
        if (iVar1 - 1U < 0xf) {
          iVar10 = 0x10;
        }
        p->nSize = 0;
        p->nCap = iVar10;
        if (iVar10 == 0) {
          piVar5 = (int *)0x0;
        }
        else {
          piVar5 = (int *)malloc((long)iVar10 * 4);
        }
        p->pArray = piVar5;
        p_00 = (Vec_Int_t *)malloc(0x10);
        p_00->nSize = 0;
        p_00->nCap = iVar10;
        if (iVar10 == 0) {
          piVar5 = (int *)0x0;
        }
        else {
          piVar5 = (int *)malloc((long)iVar10 << 2);
        }
        p_00->pArray = piVar5;
        iVar4 = iVar14;
        if (0 < iVar1) {
          lVar15 = 0;
          do {
            lVar6 = (long)iDep[pVVar13->pArray[lVar15]]->nSize;
            if (lVar6 < 1) {
              iVar10 = 0;
            }
            else {
              lVar9 = 0;
              iVar10 = 0;
              do {
                iVar10 = iVar10 + oGroup[iDep[pVVar13->pArray[lVar15]]->pArray[lVar9]];
                lVar9 = lVar9 + 1;
              } while (lVar6 != lVar9);
            }
            Vec_IntPush(p,iVar10);
            if (0 < (long)p_00->nSize) {
              lVar6 = 0;
              do {
                if (p_00->pArray[lVar6] == iVar10) goto LAB_00298e83;
                lVar6 = lVar6 + 1;
              } while (p_00->nSize != lVar6);
            }
            Vec_IntPushOrder(p_00,iVar10);
LAB_00298e83:
            lVar15 = lVar15 + 1;
            pVVar13 = iMatch[lVar12];
          } while (lVar15 < pVVar13->nSize);
          lVar15 = (long)p_00->nSize;
          if (1 < lVar15) {
            iVar4 = p_00->nSize + iVar14 + -1;
            do {
              if (0 < pVVar13->nSize) {
                uVar11 = 0;
                do {
                  iVar10 = (int)uVar11;
                  if (iVar10 < 0) {
LAB_002990a5:
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                  }
                  uVar2 = p->nSize;
                  if ((int)uVar2 <= iVar10) goto LAB_002990a5;
                  piVar5 = p->pArray;
                  if (piVar5[uVar11] == p_00->pArray[lVar15 + -1]) {
                    Vec_IntPush(iMatch[(long)iVar14 + (long)*iLastItem],pVVar13->pArray[uVar11]);
                    pVVar13 = iMatch[lVar12];
                    if (iVar10 < pVVar13->nSize) {
                      piVar3 = pVVar13->pArray;
                      iGroup[piVar3[uVar11]] = *iLastItem + iVar14;
                      uVar8 = pVVar13->nSize;
                      if (iVar10 < (int)uVar8) {
                        uVar7 = 1;
LAB_00298f77:
                        if (piVar3[uVar7 - 1] != piVar3[uVar11]) goto code_r0x00298f7d;
                        if ((int)uVar7 < (int)uVar8) {
                          do {
                            piVar3[uVar7 - 1] = piVar3[uVar7];
                            uVar7 = uVar7 + 1;
                            uVar8 = pVVar13->nSize;
                          } while ((int)uVar7 < (int)uVar8);
                        }
                        pVVar13->nSize = uVar8 - 1;
LAB_00298fab:
                        uVar7 = 1;
                        while (piVar5[uVar7 - 1] != piVar5[uVar11]) {
                          bVar16 = uVar7 == uVar2;
                          uVar7 = uVar7 + 1;
                          if (bVar16) goto LAB_00298ff1;
                        }
                        if ((int)uVar7 < (int)uVar2) {
                          do {
                            piVar5[uVar7 - 1] = piVar5[uVar7];
                            uVar7 = uVar7 + 1;
                          } while (uVar2 != (uint)uVar7);
                        }
                        p->nSize = uVar2 - 1;
LAB_00298ff1:
                        iVar10 = iVar10 + -1;
                        goto LAB_00298ff8;
                      }
                    }
                    goto LAB_002990a5;
                  }
LAB_00298ff8:
                  uVar11 = (ulong)(iVar10 + 1U);
                } while ((int)(iVar10 + 1U) < pVVar13->nSize);
              }
              iVar14 = iVar14 + 1;
              lVar15 = lVar15 + -1;
              p_00->nSize = (int)lVar15;
            } while (iVar14 != iVar4);
          }
        }
        if (p->pArray != (int *)0x0) {
          free(p->pArray);
        }
        free(p);
        if (p_00->pArray != (int *)0x0) {
          free(p_00->pArray);
        }
        free(p_00);
        iVar10 = *iLastItem;
        iVar14 = iVar4;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar10);
  }
  *iLastItem = iVar10 + iVar14;
  return iVar14;
code_r0x00298f7d:
  bVar16 = uVar7 == uVar8;
  uVar7 = uVar7 + 1;
  if (bVar16) goto LAB_00298fab;
  goto LAB_00298f77;
}

Assistant:

int iSplitByDep(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, Vec_Int_t** iMatch, int* iGroup, int* iLastItem, int* oGroup)
{
    int i, j, k;    
    int numOfItemsAdded = 0;
    Vec_Int_t * array, * sortedArray;    

    for(i = 0; i < *iLastItem; i++)
    {
        if(Vec_IntSize(iMatch[i]) == 1)
            continue;
        
        array = Vec_IntAlloc( Vec_IntSize(iMatch[i]) );
        sortedArray = Vec_IntAlloc( Vec_IntSize(iMatch[i]) );

        for(j = 0; j < Vec_IntSize(iMatch[i]); j++)
        {        
            int factor, encode;

            encode = 0;
            factor = 1;    
            
            for(k = 0; k < Vec_IntSize(iDep[Vec_IntEntry(iMatch[i], j)]); k++)                            
                encode += oGroup[Vec_IntEntry(iDep[Vec_IntEntry(iMatch[i], j)], k)] * factor;                        

            Vec_IntPush(array, encode);
            Vec_IntPushUniqueOrder(sortedArray, encode);
            
            //printf("%d ", Vec_IntEntry(array, j));
        }            
                
        while( Vec_IntSize(sortedArray) > 1 )
        {            
            for(k = 0; k < Vec_IntSize(iMatch[i]); k++) 
            {
                if(Vec_IntEntry(array, k) == Vec_IntEntryLast(sortedArray))
                {
                    Vec_IntPush(iMatch[*iLastItem+numOfItemsAdded], Vec_IntEntry(iMatch[i], k));
                    iGroup[Vec_IntEntry(iMatch[i], k)] = *iLastItem+numOfItemsAdded;
                    Vec_IntRemove( iMatch[i], Vec_IntEntry(iMatch[i], k) );                            
                    Vec_IntRemove( array, Vec_IntEntry(array, k) );    
                    k--;
                }
            }
            numOfItemsAdded++;
            Vec_IntPop(sortedArray);    
        }

        Vec_IntFree( array );        
        Vec_IntFree( sortedArray );    
        //printf("\n");
    }    

    *iLastItem += numOfItemsAdded;

    /*printf("\n");
    for(j = 0; j < *iLastItem ; j++)
    {
        printf("iMatch %d: ", j);
        for(i = 0; i < Vec_IntSize(iMatch[j]); i++)
            printf("%d ", Vec_IntEntry(iMatch[j], i));
        printf("\n");
    }*/

    return numOfItemsAdded;    
}